

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::NaVector(NaVector *this,NaVector *rVect)

{
  uint uVar1;
  undefined4 uVar2;
  ulong uVar3;
  void *pvVar4;
  long *in_RSI;
  long *in_RDI;
  
  *in_RDI = (long)&PTR__NaVector_00197ae8;
  *(undefined1 *)(in_RDI + 1) = 1;
  uVar1 = (**(code **)(*in_RSI + 0x30))();
  uVar3 = SUB168(ZEXT416(uVar1) * ZEXT816(8),0);
  if (SUB168(ZEXT416(uVar1) * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  in_RDI[2] = (long)pvVar4;
  uVar2 = (**(code **)(*in_RSI + 0x30))();
  *(undefined4 *)((long)in_RDI + 0xc) = uVar2;
  (**(code **)(*in_RDI + 0x10))(in_RDI,in_RSI);
  return;
}

Assistant:

NaVector::NaVector (const NaVector& rVect)
{
    // Create the same vector
    bOwnStorage = true;
    pVect = new NaReal[rVect.dim()];
    nDim = rVect.dim();

    // Copy the contents of that vector to this one
    operator=(rVect);
}